

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureCompletenessTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::Incomplete2DSizeCase::createTexture(Incomplete2DSizeCase *this)

{
  ostringstream *this_00;
  TextureFormat TVar1;
  char *extension;
  bool bVar2;
  uint uVar3;
  GLenum err;
  size_t sVar4;
  uint uVar5;
  uint uVar6;
  int level;
  int iVar7;
  int width;
  long lVar8;
  GLuint texture;
  TextureFormat local_1f8;
  TextureFormat fmt;
  undefined1 local_1e8 [16];
  TextureLevel levelData;
  undefined1 local_1b0 [32];
  void *local_190;
  ios_base local_138 [264];
  
  fmt = glu::mapGLTransferFormat(0x1908,0x1401);
  tcu::TextureLevel::TextureLevel(&levelData,&fmt);
  TVar1 = (TextureFormat)((this->super_Tex2DCompletenessCase).m_testCtx)->m_log;
  glwGenTextures(1,&texture);
  glwPixelStorei(0xcf5,1);
  glwBindTexture(0xde1,texture);
  glwTexParameteri(0xde1,0x2802,0x2901);
  glwTexParameteri(0xde1,0x2803,0x2901);
  glwTexParameteri(0xde1,0x2801,0x2700);
  glwTexParameteri(0xde1,0x2800,0x2600);
  uVar6 = (this->m_size).m_data[0];
  uVar3 = 0x20;
  uVar5 = 0x20;
  if (uVar6 != 0) {
    uVar5 = 0x1f;
    if (uVar6 != 0) {
      for (; uVar6 >> uVar5 == 0; uVar5 = uVar5 - 1) {
      }
    }
    uVar5 = uVar5 ^ 0x1f;
  }
  uVar6 = (this->m_size).m_data[1];
  if (uVar6 != 0) {
    uVar3 = 0x1f;
    if (uVar6 != 0) {
      for (; uVar6 >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    uVar3 = uVar3 ^ 0x1f;
  }
  uVar6 = 0x1f - uVar3;
  if ((int)(0x1f - uVar3) < (int)(0x1f - uVar5)) {
    uVar6 = 0x1f - uVar5;
  }
  local_1f8 = TVar1;
  if (uVar6 < 0x7fffffff) {
    level = 0;
    do {
      iVar7 = *(int *)&(this->super_Tex2DCompletenessCase).field_0x84;
      if (level == iVar7) {
        width = (this->m_invalidLevelSize).m_data[0];
      }
      else {
        width = (this->m_size).m_data[0] >> ((byte)level & 0x1f);
        if (width < 2) {
          width = 1;
        }
      }
      if (level == iVar7) {
        iVar7 = (this->m_invalidLevelSize).m_data[1];
      }
      else {
        iVar7 = (this->m_size).m_data[1] >> ((byte)level & 0x1f);
        if (iVar7 < 2) {
          iVar7 = 1;
        }
      }
      tcu::TextureLevel::setSize(&levelData,(this->m_size).m_data[0],(this->m_size).m_data[1],1);
      tcu::TextureLevel::getAccess((PixelBufferAccess *)local_1b0,&levelData);
      local_1e8._0_4_ = 0.0;
      local_1e8._4_4_ = 0.0;
      local_1e8._8_8_ = &DAT_3f8000003f800000;
      tcu::clear((PixelBufferAccess *)local_1b0,(Vec4 *)local_1e8);
      tcu::TextureLevel::getAccess((PixelBufferAccess *)local_1b0,&levelData);
      glwTexImage2D(0xde1,level,0x1908,width,iVar7,0,0x1908,0x1401,local_190);
      level = level + 1;
    } while (uVar6 + 1 != level);
  }
  err = glwGetError();
  glu::checkError(err,"Set texturing state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureCompletenessTests.cpp"
                  ,0x127);
  uVar6 = (this->m_size).m_data[0];
  if (((uVar6 & uVar6 - 1) != 0) && (uVar6 = (this->m_size).m_data[1], (uVar6 & uVar6 - 1) != 0)) {
    lVar8 = 0;
    do {
      extension = *(char **)((long)createTexture::s_relaxingExtensions + lVar8);
      bVar2 = isExtensionSupported(this->m_ctxInfo,extension);
      if (bVar2) {
        this_00 = (ostringstream *)(local_1b0 + 8);
        local_1b0._0_4_ = local_1f8.order;
        local_1b0._4_4_ = local_1f8.type;
        std::__cxx11::ostringstream::ostringstream(this_00);
        sVar4 = strlen(extension);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,extension,sVar4);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00," supported, assuming completeness test to pass.",0x2f);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::ios_base::~ios_base(local_138);
        (this->super_Tex2DCompletenessCase).m_compareColor.m_value = 0xffff0000;
        break;
      }
      lVar8 = lVar8 + 8;
    } while (lVar8 == 8);
  }
  tcu::TextureLevel::~TextureLevel(&levelData);
  return;
}

Assistant:

void Incomplete2DSizeCase::createTexture (void)
{
	static const char* const s_relaxingExtensions[] =
	{
		"GL_OES_texture_npot",
		"GL_NV_texture_npot_2D_mipmap",
	};

	tcu::TextureFormat		fmt				= glu::mapGLTransferFormat(GL_RGBA, GL_UNSIGNED_BYTE);
	tcu::TextureLevel		levelData		(fmt);
	TestLog&				log				= m_testCtx.getLog();

	GLuint texture;
	glGenTextures	(1, &texture);
	glPixelStorei	(GL_UNPACK_ALIGNMENT, 1);
	glBindTexture	(GL_TEXTURE_2D, texture);

	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,		GL_REPEAT);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,		GL_REPEAT);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,	GL_NEAREST_MIPMAP_NEAREST);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,	GL_NEAREST);

	int numLevels = 1 + de::max(deLog2Floor32(m_size.x()), deLog2Floor32(m_size.y()));

	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		int	levelW = (levelNdx == m_invalidLevelNdx) ? m_invalidLevelSize.x() : de::max(1, m_size.x() >> levelNdx);
		int	levelH = (levelNdx == m_invalidLevelNdx) ? m_invalidLevelSize.y() : de::max(1, m_size.y() >> levelNdx);

		levelData.setSize(m_size.x(), m_size.y());
		clear(levelData.getAccess(), tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f));

		glTexImage2D(GL_TEXTURE_2D, levelNdx, GL_RGBA, levelW, levelH, 0, GL_RGBA, GL_UNSIGNED_BYTE, levelData.getAccess().getDataPtr());
	}

	GLU_CHECK_MSG("Set texturing state");

	// If size not allowed in core, search for relaxing extensions
	if (!deIsPowerOfTwo32(m_size.x()) && !deIsPowerOfTwo32(m_size.y()))
	{
		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_relaxingExtensions); ++ndx)
		{
			if (isExtensionSupported(m_ctxInfo, s_relaxingExtensions[ndx]))
			{
				log << TestLog::Message << s_relaxingExtensions[ndx] << " supported, assuming completeness test to pass." << TestLog::EndMessage;
				m_compareColor = RGBA(0,0,255,255);
				break;
			}
		}
	}
}